

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> * __thiscall
kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator=
          (ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *other)

{
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *other_local;
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Question *)0x0;
  other->pos = (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)0x0;
  other->endPtr = (Question *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }